

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

int mj_write_jpeg_to_file(mj_jpeg_t *m,char *filename,int options)

{
  uchar *__ptr;
  int iVar1;
  FILE *__s;
  size_t len;
  uchar *buffer;
  size_t local_38;
  uchar *local_30;
  
  local_30 = (uchar *)0x0;
  local_38 = 0;
  if (m == (mj_jpeg_t *)0x0) {
    iVar1 = 2;
  }
  else {
    __s = fopen(filename,"wb");
    if (__s == (FILE *)0x0) {
      iVar1 = 7;
    }
    else {
      mj_write_jpeg_to_memory(m,&local_30,&local_38,options);
      __ptr = local_30;
      fwrite(local_30,1,local_38,__s);
      fclose(__s);
      free(__ptr);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mj_write_jpeg_to_file(mj_jpeg_t *m, char *filename, int options) {
    FILE *         fp;
    unsigned char *buffer = NULL;
    size_t         len = 0;

    if(m == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    fp = fopen(filename, "wb");
    if(fp == NULL) {
        return MJ_ERR_FILEIO;
    }

    mj_write_jpeg_to_memory(m, &buffer, &len, options);

    fwrite(buffer, 1, len, fp);
    fclose(fp);

    free(buffer);

    return MJ_OK;
}